

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void clearAndDestroyQLayoutItem(QLayoutItem *item)

{
  int iVar1;
  long *plVar2;
  QLayoutItem *item_00;
  undefined4 extraout_var;
  long *in_RDI;
  QLayoutItem *child;
  QLayout *layout;
  
  if (in_RDI != (long *)0x0) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0x68))();
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))();
    }
    item_00 = (QLayoutItem *)(**(code **)(*in_RDI + 0x70))();
    if (item_00 != (QLayoutItem *)0x0) {
      while (iVar1 = (*item_00->_vptr_QLayoutItem[0x16])(item_00,0),
            CONCAT44(extraout_var,iVar1) != 0) {
        clearAndDestroyQLayoutItem(item_00);
      }
    }
    if (in_RDI != (long *)0x0) {
      (**(code **)(*in_RDI + 8))();
    }
  }
  return;
}

Assistant:

static void clearAndDestroyQLayoutItem(QLayoutItem *item)
{
    if (Q_LIKELY(item)) {
        delete item->widget();
        if (QLayout *layout = item->layout()) {
            while (QLayoutItem *child = layout->takeAt(0))
                clearAndDestroyQLayoutItem(child);
        }
        delete item;
    }
}